

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_of_suite.cpp
# Opt level: O0

void all_array_wstring(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> *local_420;
  basic_variable<std::allocator<char>_> *local_400;
  basic_variable<std::allocator<char>_> *local_3e0;
  iterator local_3d0;
  iterator local_3b8;
  basic_variable<std::allocator<char>_> *local_3a0;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  basic_variable<std::allocator<char>_> local_338;
  basic_variable<std::allocator<char>_> local_308;
  undefined1 local_2d8 [24];
  variable data_2;
  iterator local_290;
  iterator local_278;
  basic_variable<std::allocator<char>_> *local_260;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 local_198 [24];
  variable data_1;
  iterator local_150;
  iterator local_138;
  basic_variable<std::allocator<char>_> *local_110;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_110 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,L"alpha");
  local_110 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,L"bravo");
  local_110 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,L"charlie");
  local_110 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,L"delta");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_3e0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_3e0 = local_3e0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3e0);
  } while (local_3e0 != &local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_150,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::
          all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                    (&local_138,&local_150);
  boost::detail::test_impl
            ("std::all_of(data.begin(), data.end(), is<wstring>())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x6a,"void all_array_wstring()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_260 = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_260,"alpha");
  local_260 = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_260,L"bravo");
  local_260 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_260,L"charlie");
  local_260 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_260,L"delta");
  local_198._0_8_ = &local_258;
  local_198._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_198);
  local_400 = (basic_variable<std::allocator<char>_> *)local_198;
  do {
    local_400 = local_400 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_400);
  } while (local_400 != &local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_290,(basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  bVar1 = std::
          all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                    (&local_278,&local_290);
  boost::detail::test_impl
            ("!std::all_of(data.begin(), data.end(), is<wstring>())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x6e,"void all_array_wstring()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_290);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  local_3a0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,"alpha");
  local_3a0 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,"bravo");
  local_3a0 = &local_338;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,L"charlie");
  local_3a0 = &local_308;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,L"delta");
  local_2d8._0_8_ = &local_398;
  local_2d8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_2d8);
  local_420 = (basic_variable<std::allocator<char>_> *)local_2d8;
  do {
    local_420 = local_420 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_420);
  } while (local_420 != &local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3b8,(basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3d0,(basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  bVar1 = std::
          all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                    (&local_3b8,&local_3d0);
  boost::detail::test_impl
            ("!std::all_of(data.begin(), data.end(), is<wstring>())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x72,"void all_array_wstring()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  return;
}

Assistant:

void all_array_wstring()
{
    {
        variable data = { L"alpha", L"bravo", L"charlie", L"delta" };
        TRIAL_PROTOCOL_TEST(std::all_of(data.begin(), data.end(), is<wstring>()));
    }
    {
        variable data = { "alpha", L"bravo", u"charlie", U"delta" };
        TRIAL_PROTOCOL_TEST(!std::all_of(data.begin(), data.end(), is<wstring>()));
    }
    {
        variable data = { "alpha", "bravo", u"charlie", U"delta" };
        TRIAL_PROTOCOL_TEST(!std::all_of(data.begin(), data.end(), is<wstring>()));
    }
}